

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_chunk.cpp
# Opt level: O2

void __thiscall duckdb::DataChunk::Copy(DataChunk *this,DataChunk *other,idx_t offset)

{
  const_reference source;
  reference target;
  idx_t i;
  ulong __n;
  
  for (__n = 0; __n < (ulong)(((long)(this->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x68);
      __n = __n + 1) {
    source = vector<duckdb::Vector,_true>::get<true>(&this->data,__n);
    target = vector<duckdb::Vector,_true>::get<true>(&other->data,__n);
    VectorOperations::Copy(source,target,this->count,offset,0);
  }
  other->count = this->count - offset;
  return;
}

Assistant:

void DataChunk::Copy(DataChunk &other, idx_t offset) const {
	D_ASSERT(ColumnCount() == other.ColumnCount());
	D_ASSERT(other.size() == 0);

	for (idx_t i = 0; i < ColumnCount(); i++) {
		D_ASSERT(other.data[i].GetVectorType() == VectorType::FLAT_VECTOR);
		VectorOperations::Copy(data[i], other.data[i], size(), offset, 0);
	}
	other.SetCardinality(size() - offset);
}